

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::Conv1DNarrow::forward_impl
          (Conv1DNarrow *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  Scalar *pSVar4;
  uint k;
  ulong col;
  uint i;
  ulong row;
  uint j;
  ulong col_00;
  Scalar local_a8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> f;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  
  Tensor::operator*(&x,*(xs->
                        super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&f,(xs->
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]);
  Tensor::operator*(&y,fx);
  uVar3 = 1;
  if (1 < (this->super_Node).dim.nd) {
    uVar3 = (ulong)(this->super_Node).dim.d[1];
  }
  for (row = 0; row != (uint)x.
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_rows.m_value; row = row + 1) {
    for (col_00 = 0; col_00 != uVar3; col_00 = col_00 + 1) {
      col = 0;
      local_a8 = 0.0;
      while ((uint)f.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value != col) {
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)&f,row,col);
        SVar1 = *pSVar4;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)&x,row,(ulong)(uint)((int)col_00 + (int)col));
        col = col + 1;
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)local_a8),ZEXT416((uint)SVar1),ZEXT416((uint)*pSVar4)
                                );
        local_a8 = auVar2._0_4_;
      }
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&y,row,col_00);
      *pSVar4 = local_a8;
    }
  }
  return;
}

Assistant:

void Conv1DNarrow::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DNarrow::forward not implemented for CUDA");
#else
  // TODO this is a bad implementation- rewrite to use unsupported Eigen tensor library
  auto x = **xs[0];  // input
  auto f = **xs[1];  // filter
  auto y = *fx;
  const unsigned rows = x.rows();
  const unsigned ycols = dim.cols();
  const unsigned fcols = f.cols();
  for (unsigned i = 0; i < rows; ++i) {
    for (unsigned j = 0; j < ycols; ++j) {
      float t = 0;
      for (unsigned k = 0; k < fcols; ++k)
        t += f(i, k) * x(i, j + k);
      y(i, j) = t;
    }
  }
#endif
}